

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_execute(lua_State *L)

{
  long lVar1;
  int iVar2;
  char *__command;
  char *in_RDI;
  lua_State *unaff_retaddr;
  int stat;
  char *cmd;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  size_t *in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffffc;
  
  __command = luaL_optlstring(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI,
                              in_stack_ffffffffffffffe8);
  iVar2 = system(__command);
  if (__command == (char *)0x0) {
    lVar1 = *(long *)(in_RDI + 0x18);
    *(long *)(in_RDI + 0x18) = lVar1 + 8;
    *(undefined4 *)(lVar1 + 4) = 0xfffffffd;
    iVar2 = 1;
  }
  else {
    iVar2 = luaL_execresult((lua_State *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc);
  }
  return iVar2;
}

Assistant:

LJLIB_CF(os_execute)
{
#if LJ_NO_SYSTEM
#if LJ_52
  errno = ENOSYS;
  return luaL_fileresult(L, 0, NULL);
#else
  lua_pushinteger(L, -1);
  return 1;
#endif
#else
  const char *cmd = luaL_optstring(L, 1, NULL);
  int stat = system(cmd);
#if LJ_52
  if (cmd)
    return luaL_execresult(L, stat);
  setboolV(L->top++, 1);
#else
  setintV(L->top++, stat);
#endif
  return 1;
#endif
}